

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.cpp
# Opt level: O2

void __thiscall curlpp::internal::SList::constructFrom(SList *this,curl_slist *list)

{
  allocator local_49;
  value_type local_48;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mData);
  for (; list != (curl_slist *)0x0; list = list->next) {
    std::__cxx11::string::string((string *)&local_48,list->data,&local_49);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->mData,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  update(this);
  return;
}

Assistant:

void 
SList::constructFrom(curl_slist * list)
{
	mData.clear();

	curl_slist * c = list;
	while(c)
	{
		mData.push_back(c->data);
		c = c->next;
	}

	update();
}